

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O2

int vkt::tessellation::numVerticesPerPrimitive(TessPrimitiveType primitiveType,bool usePointMode)

{
  int iVar1;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,usePointMode) != 0) {
    return 1;
  }
  iVar1 = 0;
  if (primitiveType < TESSPRIMITIVETYPE_LAST) {
    iVar1 = *(int *)(&DAT_009c3560 + (ulong)primitiveType * 4);
  }
  return iVar1;
}

Assistant:

int numVerticesPerPrimitive (const TessPrimitiveType primitiveType, const bool usePointMode)
{
	if (usePointMode)
		return 1;

	switch (primitiveType)
	{
		case TESSPRIMITIVETYPE_TRIANGLES:	return 3;
		case TESSPRIMITIVETYPE_QUADS:		return 3;  // quads are composed of two triangles
		case TESSPRIMITIVETYPE_ISOLINES:	return 2;
		default:
			DE_ASSERT(false);
			return 0;
	}
}